

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

EventRegistry * __thiscall
license::FullLicenseInfo::validate
          (EventRegistry *__return_storage_ptr__,FullLicenseInfo *this,int sw_version)

{
  FUNCTION_RETURN FVar1;
  EVENT_TYPE event_00;
  char *pcVar2;
  char *signatureB64;
  time_t tVar3;
  time_t tVar4;
  char local_98 [4];
  EVENT_TYPE event;
  PcSignature str_code;
  time_t now;
  undefined1 local_50 [7];
  bool sigVerified;
  FUNCTION_RETURN local_30;
  FUNCTION_RETURN sigVer;
  undefined1 local_1d;
  int local_1c;
  FullLicenseInfo *pFStack_18;
  int sw_version_local;
  FullLicenseInfo *this_local;
  EventRegistry *er;
  
  local_1d = 0;
  local_1c = sw_version;
  pFStack_18 = this;
  this_local = (FullLicenseInfo *)__return_storage_ptr__;
  EventRegistry::EventRegistry(__return_storage_ptr__);
  os_initialize();
  printForSign_abi_cxx11_((string *)local_50,this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  signatureB64 = (char *)std::__cxx11::string::c_str();
  FVar1 = verifySignature(pcVar2,signatureB64);
  std::__cxx11::string::~string((string *)local_50);
  local_30 = FVar1;
  if (FVar1 == FUNC_RET_OK) {
    EventRegistry::addEvent(__return_storage_ptr__,LICENSE_VERIFIED,SVRT_INFO);
  }
  else {
    EventRegistry::addEvent(__return_storage_ptr__,LICENSE_CORRUPTED,SVRT_ERROR);
  }
  if ((this->has_expiry & 1U) != 0) {
    tVar3 = time((time_t *)0x0);
    tVar4 = expires_on(this);
    if (tVar4 < tVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(str_code + 0x10),"",(allocator *)(str_code + 0xf));
      EventRegistry::addEvent
                (__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR,(string *)(str_code + 0x10));
      std::__cxx11::string::~string((string *)(str_code + 0x10));
      std::allocator<char>::~allocator((allocator<char> *)(str_code + 0xf));
    }
    tVar4 = valid_from(this);
    if (tVar3 < tVar4) {
      EventRegistry::addEvent(__return_storage_ptr__,PRODUCT_EXPIRED,SVRT_ERROR);
    }
  }
  if ((this->has_client_sig & 1U) != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strncpy(local_98,pcVar2,0x14);
    event_00 = validate_pc_signature(local_98);
    if (event_00 != LICENSE_OK) {
      EventRegistry::addEvent(__return_storage_ptr__,event_00,SVRT_ERROR);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

EventRegistry FullLicenseInfo::validate(int sw_version) {
	EventRegistry er;
	os_initialize();
	FUNCTION_RETURN sigVer = verifySignature(printForSign().c_str(),
			license_signature.c_str());
	bool sigVerified = sigVer == FUNC_RET_OK;
	if (sigVerified) {
		er.addEvent(LICENSE_VERIFIED, SVRT_INFO);
	} else {
		er.addEvent(LICENSE_CORRUPTED, SVRT_ERROR);
	}
	if (has_expiry) {
		time_t now = time(NULL);
		if (expires_on() < now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR, "");
		}
		if (valid_from() > now) {
			er.addEvent(PRODUCT_EXPIRED, SVRT_ERROR);
		}
	}
	if (has_client_sig) {
		PcSignature str_code;
		strncpy(str_code, client_signature.c_str(), sizeof(str_code)-1);
		EVENT_TYPE event = validate_pc_signature(str_code);
		if (event != LICENSE_OK) {
			er.addEvent(event, SVRT_ERROR);
		}
	}
	return er;
}